

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O2

uint __thiscall
duckdb::BitReader::ReadBytes<unsigned_int>(BitReader *this,uint8_t *bytes,uint8_t *remainder)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte local_29;
  
  uVar3 = 0;
  for (local_29 = 0; local_29 < *bytes; local_29 = local_29 + 1) {
    bVar1 = InnerReadByte(this,&local_29);
    uVar3 = uVar3 << 8 | (uint)bVar1;
  }
  bVar1 = *remainder;
  bVar2 = InnerRead(this,remainder,bytes);
  this->index = this->index + (uint)*remainder + (uint)*bytes * 8;
  return (uint)bVar2 | uVar3 << (bVar1 & 0x1f);
}

Assistant:

inline T ReadBytes(const uint8_t &bytes, const uint8_t &remainder) {
		T result = 0;
		for (uint8_t i = 0; i < bytes; i++) {
			result = result << 8 | InnerReadByte(i);
		}
		result = result << remainder | InnerRead(remainder, bytes);
		index += static_cast<uint32_t>(bytes << 3) + remainder;
		return result;
	}